

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O0

void __thiscall
cmQtAutoGenerators::WriteOldMocDefinitionsFile(cmQtAutoGenerators *this,string *targetDirectory)

{
  _Ios_Openmode _Var1;
  ostream *poVar2;
  string local_268;
  undefined1 local_248 [8];
  ofstream outfile;
  undefined1 local_38 [8];
  string filename;
  string *targetDirectory_local;
  cmQtAutoGenerators *this_local;
  
  filename.field_2._8_8_ = targetDirectory;
  cmsys::SystemTools::CollapseFullPath((string *)local_38,targetDirectory);
  cmsys::SystemTools::ConvertToUnixSlashes((string *)local_38);
  std::__cxx11::string::operator+=((string *)local_38,"/AutomocOldMocDefinitions.cmake");
  std::ofstream::ofstream(local_248);
  _Var1 = std::__cxx11::string::c_str();
  std::ofstream::open(local_248,_Var1);
  poVar2 = std::operator<<((ostream *)local_248,"set(AM_OLD_COMPILE_SETTINGS ");
  cmOutputConverter::EscapeForCMake(&local_268,&this->CurrentCompileSettingsStr);
  poVar2 = std::operator<<(poVar2,(string *)&local_268);
  std::operator<<(poVar2,")\n");
  std::__cxx11::string::~string((string *)&local_268);
  std::ofstream::close();
  std::ofstream::~ofstream(local_248);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void
cmQtAutoGenerators::WriteOldMocDefinitionsFile(
                                            const std::string& targetDirectory)
{
  std::string filename(
      cmSystemTools::CollapseFullPath(targetDirectory));
  cmSystemTools::ConvertToUnixSlashes(filename);
  filename += "/AutomocOldMocDefinitions.cmake";

  cmsys::ofstream outfile;
  outfile.open(filename.c_str(),
               std::ios::trunc);
  outfile << "set(AM_OLD_COMPILE_SETTINGS "
              << cmOutputConverter::EscapeForCMake(
                 this->CurrentCompileSettingsStr) << ")\n";

  outfile.close();
}